

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void sys_set_priority(int mode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sched_param par;
  sched_param local_3c;
  rlimit local_38;
  
  sched_get_priority_min(1);
  iVar1 = sched_get_priority_max(1);
  uVar3 = 0;
  if (mode == 1) {
    uVar3 = iVar1 - 7U;
  }
  local_3c.__sched_priority = uVar3;
  if (mode == 2) {
    local_3c.__sched_priority = iVar1 - 5U;
  }
  iVar2 = sched_setscheduler(0,(uint)(mode != 0),&local_3c);
  if (iVar2 < 0) {
    if (mode == 2) {
      fprintf(_stderr,"priority %d scheduling failed.\n",(ulong)(iVar1 - 5U));
      goto LAB_00171a71;
    }
    post("priority %d scheduling failed; running at normal priority",(ulong)uVar3);
  }
  else {
    if (mode == 1) {
      logpost((void *)0x0,4,"priority %d scheduling enabled.\n",(ulong)(iVar1 - 7U));
      goto LAB_00171a71;
    }
    logpost((void *)0x0,4,"running at normal (non-real-time) priority.\n");
  }
  if (mode == 0) {
    munlockall();
    return;
  }
LAB_00171a71:
  local_38.rlim_cur = 0;
  local_38.rlim_max = 0;
  setrlimit(__RLIMIT_MEMLOCK,&local_38);
  iVar1 = mlockall(2);
  if ((iVar1 != -1) && (sys_verbose != 0)) {
    sys_set_priority_cold_1();
  }
  return;
}

Assistant:

void sys_set_priority(int mode)
{
#ifdef _POSIX_PRIORITY_SCHEDULING
    struct sched_param par;
    int p1, p2, p3;
    p1 = sched_get_priority_min(SCHED_FIFO);
    p2 = sched_get_priority_max(SCHED_FIFO);
#ifdef USEAPI_JACK
    p3 = (mode == MODE_WATCHDOG ? p1 + 7 : (mode == MODE_RT ? p1 + 5 : 0));
#else
    p3 = (mode == MODE_WATCHDOG ? p2 - 5 : (mode == MODE_RT ? p2 - 7 : 0));
#endif
    par.sched_priority = p3;
    if (sched_setscheduler(0,
        (mode == MODE_NRT ? SCHED_OTHER : SCHED_FIFO), &par) < 0)
    {
        if (mode == MODE_WATCHDOG)
            fprintf(stderr, "priority %d scheduling failed.\n", p3);
        else post("priority %d scheduling failed; running at normal priority",
                p3);
    }
    else
    {
        if (mode == MODE_RT)
            logpost(NULL, PD_VERBOSE, "priority %d scheduling enabled.\n", p3);
        else logpost(NULL, PD_VERBOSE, "running at normal (non-real-time) priority.\n");
    }
#endif

#if !defined(USEAPI_JACK)
    if (mode != MODE_NRT)
    {
            /* tb: force memlock to physical memory { */
        struct rlimit mlock_limit;
        mlock_limit.rlim_cur=0;
        mlock_limit.rlim_max=0;
        setrlimit(RLIMIT_MEMLOCK,&mlock_limit);
            /* } tb */
        if (mlockall(MCL_FUTURE) != -1 && sys_verbose)
            fprintf(stderr, "memory locking enabled.\n");
    }
    else munlockall();
#endif
}